

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

char * zt_opt_get_value(int argn,int defn,char **argv,zt_opt_def_t *def,int *args_consumed,
                       zt_opt_error error)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *__s1;
  int iVar4;
  char *pcVar5;
  char *__s2;
  
  pcVar3 = argv[argn];
  __s1 = def[defn].lopt;
  *args_consumed = 0;
  pcVar1 = pcVar3;
  do {
    __s2 = pcVar1;
    pcVar1 = __s2 + 1;
    pcVar5 = __s2;
  } while (*__s2 == '-');
  do {
    cVar2 = *pcVar5;
    if (cVar2 == '\0') {
      pcVar5 = (char *)0x0;
      break;
    }
    pcVar5 = pcVar5 + 1;
  } while (cVar2 != '=');
  if ((pcVar5 == (char *)0x0) &&
     ((iVar4 = strcmp(__s1,__s2), iVar4 == 0 || (pcVar5 = pcVar1, *pcVar1 == '\0')))) {
    pcVar5 = argv[(long)argn + 1];
    *args_consumed = 1;
  }
  if (pcVar5 == (char *)0x0) {
    (*error)(0x16,"while processing arg \'%s\'",pcVar3);
  }
  return pcVar5;
}

Assistant:

char *
zt_opt_get_value(int argn, int defn, char ** argv, zt_opt_def_t * def, int *args_consumed, zt_opt_error error) {
    char * p      = argv[argn];
    char * pp     = NULL;
    char * result = NULL;
    char * lopt   = def[defn].lopt;

    *args_consumed = 0;

    /* skip past any leading '-' */
    while(*p == '-') { p++; }

    pp = p;
    do {
        if (*pp == '=') {
            result = ++pp;
            break;
        }
    } while (*pp++);

    if (!result) {
        pp = p;
        /* there was no '=' embedded
         * try matching the long opt name
         */
        if (strcmp(lopt, pp) == 0) {
            result = argv[argn + 1]; /* default to the next option */
            *args_consumed = 1;
        } else {
            /* short opt */
            pp++;
            if(*pp) {
                result = pp;
            } else {
                result = argv[argn + 1];
                *args_consumed = 1;
            }
        }
    }

    if (!result) {
        error(EINVAL, "while processing arg '%s'", argv[argn]);
    }

    return result;
}